

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_disconnect_with_undo(_glist *x,t_float index1,t_float outno,t_float index2,t_float inno)

{
  undefined8 *data;
  
  canvas_disconnect(x,index1,outno,index2,inno);
  data = (undefined8 *)getbytes(0x10);
  *data = CONCAT44((int)outno,(int)index1);
  data[1] = CONCAT44((int)inno,(int)index2);
  canvas_undo_add(x,UNDO_DISCONNECT,"disconnect",data);
  return;
}

Assistant:

static void canvas_disconnect_with_undo(t_canvas *x,
    t_float index1, t_float outno, t_float index2, t_float inno)
{
    canvas_disconnect(x, index1, outno, index2, inno);
    canvas_undo_add(x, UNDO_DISCONNECT, "disconnect", canvas_undo_set_disconnect(x,
        index1, outno, index2, inno));
}